

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QHybrid.cpp
# Opt level: O0

void __thiscall QHybrid::Initialize(QHybrid *this)

{
  undefined8 uVar1;
  long *plVar2;
  ulong uVar3;
  size_t sVar4;
  ostream *poVar5;
  long *in_RDI;
  size_t historiesThisAgent;
  Index aI;
  size_t nrT;
  Index t;
  size_t nr;
  Index in_stack_ffffffffffffff28;
  Index in_stack_ffffffffffffff2c;
  PlanningUnitMADPDiscrete *in_stack_ffffffffffffff30;
  QTable *this_00;
  char *in_stack_ffffffffffffff58;
  E *in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff78;
  undefined1 preserve;
  ulong in_stack_ffffffffffffff80;
  size_type in_stack_ffffffffffffff88;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffff90;
  string local_60 [32];
  long local_40;
  uint local_34;
  long local_30;
  uint local_24;
  long local_20;
  
  if (in_RDI[8] == 0) {
    uVar1 = __cxa_allocate_exception(0x28);
    E::E(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    __cxa_throw(uVar1,&E::typeinfo,E::~E);
  }
  if (((int)in_RDI[7] != 2) && ((int)in_RDI[7] != 1)) {
    uVar1 = __cxa_allocate_exception(0x28);
    E::E(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    __cxa_throw(uVar1,&E::typeinfo,E::~E);
  }
  local_20 = 0;
  for (local_24 = 0; preserve = (undefined1)(in_stack_ffffffffffffff78 >> 0x38),
      (ulong)local_24 < (ulong)in_RDI[10]; local_24 = local_24 + 1) {
    local_30 = 1;
    local_34 = 0;
    while( true ) {
      in_stack_ffffffffffffff80 = (ulong)local_34;
      plVar2 = (long *)(**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x88)) + 0x60))
                                 ((long)in_RDI + *(long *)(*in_RDI + -0x88));
      uVar3 = (**(code **)(*plVar2 + 0x30))();
      if (uVar3 <= in_stack_ffffffffffffff80) break;
      (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x88)) + 0x60))
                ((long)in_RDI + *(long *)(*in_RDI + -0x88));
      in_stack_ffffffffffffff78 =
           PlanningUnitMADPDiscrete::GetNrObservationHistories
                     (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)
      ;
      (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x88)) + 0x60))
                ((long)in_RDI + *(long *)(*in_RDI + -0x88));
      sVar4 = PlanningUnitMADPDiscrete::GetNrActionHistories
                        (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                         in_stack_ffffffffffffff28);
      local_40 = in_stack_ffffffffffffff78 * sVar4;
      local_30 = local_40 * local_30;
      local_34 = local_34 + 1;
    }
    local_20 = local_30 + local_20;
  }
  in_RDI[0xb] = local_20;
  this_00 = (QTable *)(in_RDI + 2);
  (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x88)) + 0x60))
            ((long)in_RDI + *(long *)(*in_RDI + -0x88));
  PlanningUnitMADPDiscrete::GetNrJointActions((PlanningUnitMADPDiscrete *)0x8a397c);
  boost::numeric::ublas::
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::resize(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
           (bool)preserve);
  QTable::SetToZero(this_00);
  *(undefined1 *)((long)in_RDI + 0x61) = 1;
  (**(code **)(*in_RDI + 0x48))();
  poVar5 = std::operator<<((ostream *)&std::cout,local_60);
  poVar5 = std::operator<<(poVar5," with ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,in_RDI[0xb]);
  poVar5 = std::operator<<(poVar5," JAOH in tree (");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,in_RDI[10]);
  std::operator<<(poVar5," ts), and");
  std::__cxx11::string::~string(local_60);
  poVar5 = std::operator<<((ostream *)&std::cout," vectors for ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,in_RDI[9]);
  poVar5 = std::operator<<(poVar5," ts.");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void QHybrid::Initialize()
{
#if 1 // now we can handle this case -> not working completely yet...
    if(!_m_QlastTimeSteps)
        throw(E("QHybrid::Initialize QlastTimeSteps should be valid"));
#endif

    if(!(_m_QheurTypeFirstTS==eQBG || _m_QheurTypeFirstTS==eQPOMDP))
        throw(E("QHybrid can only use QBG or QPOMDP for the first time steps"));

    // first we need to compute for how many JAOHs we will store Qvalues
    size_t nr=0;
    for(Index t=0; t<_m_horizonFirstTimeSteps ;++t)
    {
        size_t nrT=1; //the number of histories at 
        for (Index aI=0 ; aI<GetPU()->GetNrAgents(); ++aI)
        {
            size_t historiesThisAgent =  
                GetPU()->GetNrObservationHistories(aI,t) *  
                GetPU()->GetNrActionHistories(aI,t);
            nrT *= historiesThisAgent;
        }
        nr += nrT;
    }
    _m_nrJAOHinFirstTS=nr;

    _m_QValuesFirstTimeSteps.resize(_m_nrJAOHinFirstTS,
                                    GetPU()->GetNrJointActions(),
                                    false);
    _m_QValuesFirstTimeSteps.SetToZero();
    _m_initialized = true;
 
    cout << SoftPrintBrief() << " with " << _m_nrJAOHinFirstTS << " JAOH in tree ("
         << _m_horizonFirstTimeSteps << " ts), and";
    cout << " vectors for " << _m_horizonLastTimeSteps << " ts."
         << endl; 
}